

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

int Mkdir(char *dir,mode_t *mode)

{
  int iVar1;
  undefined4 local_24;
  mode_t *mode_local;
  char *dir_local;
  
  if (mode == (mode_t *)0x0) {
    local_24 = 0x1ff;
  }
  else {
    local_24 = *mode;
  }
  iVar1 = mkdir(dir,local_24);
  return iVar1;
}

Assistant:

inline int Mkdir(const char* dir, const mode_t* mode)
{
#if defined(_WIN32)
  int ret = _wmkdir(cmSystemTools::ConvertToWindowsExtendedPath(dir).c_str());
  if (ret == 0 && mode)
    cmSystemTools::SystemTools::SetPermissions(dir, *mode);
  return ret;
#else
  return mkdir(dir, mode ? *mode : 0777);
#endif
}